

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_get.cpp
# Opt level: O0

double __thiscall UniValue::get_real(UniValue *this)

{
  bool bVar1;
  runtime_error *prVar2;
  string *str;
  double local_28;
  double retval;
  UniValue *local_10;
  UniValue *this_local;
  
  local_10 = this;
  if (this->typ != VNUM) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"JSON value is not a number as expected");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  str = getValStr_abi_cxx11_(this);
  bVar1 = anon_unknown.dwarf_845ce5::ParseDouble(str,&local_28);
  if (!bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"JSON double out of range");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return local_28;
}

Assistant:

double UniValue::get_real() const
{
    if (typ != VNUM)
        throw std::runtime_error("JSON value is not a number as expected");
    double retval;
    if (!ParseDouble(getValStr(), &retval))
        throw std::runtime_error("JSON double out of range");
    return retval;
}